

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O0

void __thiscall icu_63::RangeDescriptor::setDictionaryFlag(RangeDescriptor *this)

{
  int iVar1;
  int8_t iVar2;
  int32_t iVar3;
  UnicodeString *this_00;
  ConstChar16Ptr local_40;
  UnicodeString *local_38;
  UnicodeString *setName;
  RBBINode *varRef;
  RBBINode *setRef;
  RBBINode *usetNode;
  RangeDescriptor *pRStack_10;
  int i;
  RangeDescriptor *this_local;
  
  usetNode._4_4_ = 0;
  pRStack_10 = this;
  do {
    iVar1 = usetNode._4_4_;
    iVar3 = UVector::size(this->fIncludesSets);
    if (iVar3 <= iVar1) {
      return;
    }
    setRef = (RBBINode *)UVector::elementAt(this->fIncludesSets,usetNode._4_4_);
    varRef = setRef->fParent;
    if (((varRef != (RBBINode *)0x0) &&
        (setName = (UnicodeString *)varRef->fParent, (RBBINode *)setName != (RBBINode *)0x0)) &&
       (*(int *)&(((Replaceable *)&((RBBINode *)setName)->fType)->super_UObject)._vptr_UObject == 2)
       ) {
      this_00 = &((RBBINode *)setName)->fText;
      local_38 = this_00;
      ConstChar16Ptr::ConstChar16Ptr(&local_40,setDictionaryFlag::dictionary);
      iVar2 = UnicodeString::compare(this_00,&local_40,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_40);
      if (iVar2 == '\0') {
        this->fNum = this->fNum | 0x4000;
        return;
      }
    }
    usetNode._4_4_ = usetNode._4_4_ + 1;
  } while( true );
}

Assistant:

void RangeDescriptor::setDictionaryFlag() {
    int i;

    static const char16_t *dictionary = u"dictionary";
    for (i=0; i<fIncludesSets->size(); i++) {
        RBBINode *usetNode  = (RBBINode *)fIncludesSets->elementAt(i);
        RBBINode *setRef = usetNode->fParent;
        if (setRef != nullptr) {
            RBBINode *varRef = setRef->fParent;
            if (varRef && varRef->fType == RBBINode::varRef) {
                const UnicodeString *setName = &varRef->fText;
                if (setName->compare(dictionary, -1) == 0) {
                    fNum |= RBBISetBuilder::DICT_BIT;
                    break;
                }
            }
        }
    }
}